

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_pronunciation.c
# Opt level: O2

void njd_set_pronunciation(NJD *njd)

{
  char cVar1;
  NJDNode *node;
  int iVar2;
  int size;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  NJDNode *pNVar6;
  int i;
  long lVar7;
  char **ppcVar8;
  NJD *pNVar9;
  NJDNode *pNVar10;
  long lVar11;
  NJD *local_50;
  
  pNVar9 = njd;
  while (pNVar10 = pNVar9->head, pNVar10 != (NJDNode *)0x0) {
    iVar2 = NJDNode_get_mora_size(pNVar10);
    if (iVar2 == 0) {
      NJDNode_set_read(pNVar10,(char *)0x0);
      NJDNode_set_pron(pNVar10,(char *)0x0);
      pcVar3 = NJDNode_get_string(pNVar10);
      sVar4 = strlen(pcVar3);
      for (iVar2 = 0; iVar2 < (int)sVar4; iVar2 = iVar2 + (int)lVar7) {
        for (lVar11 = 0; njd_set_pronunciation_list[lVar11] != (char *)0x0; lVar11 = lVar11 + 3) {
          for (lVar7 = 0; cVar1 = njd_set_pronunciation_list[lVar11][lVar7], cVar1 != '\0';
              lVar7 = lVar7 + 1) {
            if (pcVar3[lVar7 + iVar2] != cVar1) goto LAB_0013f4ac;
          }
          if (lVar7 != 0) {
            pcVar5 = njd_set_pronunciation_list[(int)lVar11 + 1];
            NJDNode_add_read(pNVar10,pcVar5);
            NJDNode_add_pron(pNVar10,pcVar5);
            size = atoi(njd_set_pronunciation_list[(int)lVar11 + 2]);
            NJDNode_add_mora_size(pNVar10,size);
            goto LAB_0013f4fd;
          }
LAB_0013f4ac:
        }
        lVar7 = 1;
LAB_0013f4fd:
      }
      iVar2 = NJDNode_get_mora_size(pNVar10);
      if (iVar2 != 0) {
        NJDNode_set_pos(pNVar10,anon_var_dwarf_e0b1f);
        NJDNode_set_pos_group1(pNVar10,(char *)0x0);
        NJDNode_set_pos_group2(pNVar10,(char *)0x0);
        NJDNode_set_pos_group3(pNVar10,(char *)0x0);
      }
      pcVar5 = NJDNode_get_orig(pNVar10);
      if ((*pcVar5 == '*') && (pcVar5[1] == '\0')) {
        NJDNode_set_orig(pNVar10,pcVar3);
      }
      pcVar3 = NJDNode_get_pron(pNVar10);
      if ((*pcVar3 == '*') && (pcVar3[1] == '\0')) {
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 2) {
          pcVar3 = NJDNode_get_string(pNVar10);
          iVar2 = strcmp(pcVar3,njd_set_pronunciation_symbol_list[lVar11]);
          if (iVar2 == 0) {
            pcVar3 = njd_set_pronunciation_symbol_list[lVar11 + 1];
            NJDNode_set_read(pNVar10,pcVar3);
            NJDNode_set_pron(pNVar10,pcVar3);
            break;
          }
        }
      }
      pcVar3 = NJDNode_get_pron(pNVar10);
      if ((*pcVar3 == '*') && (pcVar3[1] == '\0')) {
        NJDNode_set_read(pNVar10,anon_var_dwarf_247c);
        NJDNode_set_pron(pNVar10,anon_var_dwarf_247c);
        NJDNode_set_pos(pNVar10,anon_var_dwarf_e0b66);
      }
    }
    pNVar9 = (NJD *)&pNVar10->next;
  }
  NJD_remove_silent_node(njd);
  pNVar10 = (NJDNode *)0x0;
  pNVar9 = njd;
  while (node = pNVar9->head, node != (NJDNode *)0x0) {
    pcVar3 = NJDNode_get_pos(node);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_e0b1f);
    if (iVar2 == 0) {
      ppcVar8 = njd_set_pronunciation_list;
      do {
        pcVar3 = *ppcVar8;
        if (pcVar3 == (char *)0x0) goto LAB_0013f63f;
        pcVar5 = NJDNode_get_string(node);
        iVar2 = strcmp(pcVar5,pcVar3);
        ppcVar8 = ppcVar8 + 3;
      } while (iVar2 != 0);
      pNVar6 = node;
      if (pNVar10 != (NJDNode *)0x0) {
        pcVar3 = NJDNode_get_string(node);
        NJDNode_add_string(pNVar10,pcVar3);
        pcVar3 = NJDNode_get_orig(node);
        NJDNode_add_orig(pNVar10,pcVar3);
        pcVar3 = NJDNode_get_read(node);
        NJDNode_add_read(pNVar10,pcVar3);
        pcVar3 = NJDNode_get_pron(node);
        NJDNode_add_pron(pNVar10,pcVar3);
        iVar2 = NJDNode_get_mora_size(node);
        NJDNode_add_mora_size(pNVar10,iVar2);
        NJDNode_set_pron(node,(char *)0x0);
        pNVar6 = pNVar10;
      }
    }
    else {
LAB_0013f63f:
      pNVar6 = (NJDNode *)0x0;
    }
    pNVar10 = pNVar6;
    pNVar9 = (NJD *)&node->next;
  }
  NJD_remove_silent_node(njd);
  local_50 = njd;
LAB_0013f716:
  do {
    do {
      do {
        do {
          pNVar10 = local_50->head;
          if (pNVar10 == (NJDNode *)0x0) {
            return;
          }
          local_50 = (NJD *)&pNVar10->next;
        } while (pNVar10->next == (NJDNode *)0x0);
        pcVar3 = NJDNode_get_pron(pNVar10->next);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_25c6);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_pos(*(NJDNode **)local_50);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_e7d84 + 6);
          if (iVar2 == 0) {
            pcVar3 = NJDNode_get_pos(pNVar10);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_e687b + 3);
            if (iVar2 != 0) {
              pcVar3 = NJDNode_get_pos(pNVar10);
              iVar2 = strcmp(pcVar3,anon_var_dwarf_e7d84 + 6);
              if (iVar2 != 0) goto LAB_0013f76d;
            }
            iVar2 = NJDNode_get_mora_size(pNVar10);
            if (0 < iVar2) {
              NJDNode_set_pron(*(NJDNode **)local_50,anon_var_dwarf_e3b60 + 6);
            }
          }
        }
LAB_0013f76d:
      } while (*(_NJDNode **)local_50 == (_NJDNode *)0x0);
      pcVar3 = NJDNode_get_pos(pNVar10);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_e7d84 + 6);
    } while (iVar2 != 0);
    pcVar3 = NJDNode_get_string(*(NJDNode **)local_50);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_1cb2);
  } while (iVar2 != 0);
  pcVar3 = NJDNode_get_string(pNVar10);
  iVar2 = strcmp(pcVar3,anon_var_dwarf_e0bba);
  pcVar3 = anon_var_dwarf_e7d2c;
  if (iVar2 != 0) {
    pcVar3 = NJDNode_get_string(pNVar10);
    iVar2 = strcmp(pcVar3,anon_var_dwarf_e0bce);
    pcVar3 = anon_var_dwarf_e7d4d;
    if (iVar2 != 0) goto LAB_0013f716;
  }
  NJDNode_set_pron(pNVar10,pcVar3 + 9);
  goto LAB_0013f716;
}

Assistant:

void njd_set_pronunciation(NJD * njd)
{
   NJDNode *node;
   const char *str;
   int i, j = 0;
   int pos;
   int len;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_mora_size(node) == 0) {
         NJDNode_set_read(node, NULL);
         NJDNode_set_pron(node, NULL);
         /* if the word is kana, set them as filler */
         {
            str = NJDNode_get_string(node);
            len = strlen(str);
            for (pos = 0; pos < len;) {
               for (i = 0, j = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
                  j = strtopcmp(&str[pos], njd_set_pronunciation_list[i]);
                  if (j > 0)
                     break;
               }
               if (j > 0) {
                  pos += j;
                  NJDNode_add_read(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_pron(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_mora_size(node, atoi(njd_set_pronunciation_list[i + 2]));
               } else {
                  pos++;
               }
            }
            /* if filler, overwrite pos */
            if (NJDNode_get_mora_size(node) != 0) {
               NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_FILLER);
               NJDNode_set_pos_group1(node, NULL);
               NJDNode_set_pos_group2(node, NULL);
               NJDNode_set_pos_group3(node, NULL);
            }
            if (strcmp(NJDNode_get_orig(node), "*") == 0) {
               NJDNode_set_orig(node, str);
            }
         }
         /* if known symbol, set the pronunciation */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            for (i = 0; njd_set_pronunciation_symbol_list[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_symbol_list[i]) == 0) {
                  NJDNode_set_read(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  NJDNode_set_pron(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  break;
               }
            }
         }
         /* if the word is not kana, set pause symbol */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            NJDNode_set_read(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_KIGOU);
         }
      }
   }
   NJD_remove_silent_node(njd);

   /* chain kana sequence */
   {
      NJDNode *head_of_kana_filler_sequence = NULL;
      int find;
      for (node = njd->head; node != NULL; node = node->next) {
         if (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_FILLER) == 0) {
            find = 0;
            for (i = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_list[i]) == 0) {
                  find = 1;
                  if (head_of_kana_filler_sequence == NULL) {
                     head_of_kana_filler_sequence = node;
                  } else {
                     NJDNode_add_string(head_of_kana_filler_sequence, NJDNode_get_string(node));
                     NJDNode_add_orig(head_of_kana_filler_sequence, NJDNode_get_orig(node));
                     NJDNode_add_read(head_of_kana_filler_sequence, NJDNode_get_read(node));
                     NJDNode_add_pron(head_of_kana_filler_sequence, NJDNode_get_pron(node));
                     NJDNode_add_mora_size(head_of_kana_filler_sequence,
                                           NJDNode_get_mora_size(node));
                     NJDNode_set_pron(node, NULL);
                  }
                  break;
               }
            }
            if (find == 0) {
               head_of_kana_filler_sequence = NULL;
            }
         } else {
            head_of_kana_filler_sequence = NULL;
         }
      }
   }
   NJD_remove_silent_node(njd);

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL
          && strcmp(NJDNode_get_pron(node->next), NJD_SET_PRONUNCIATION_U) == 0
          && strcmp(NJDNode_get_pos(node->next), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_DOUSHI) == 0
              || strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0)
          && NJDNode_get_mora_size(node) > 0) {
         NJDNode_set_pron(node->next, NJD_SET_PRONUNCIATION_CHOUON);
      }
      if (node->next != NULL
          && strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && strcmp(NJDNode_get_string(node->next), NJD_SET_PRONUNCIATION_QUESTION) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_DESU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_DESU_PRON);
         else if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_MASU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_MASU_PRON);
      }
   }
}